

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaSimBase.c
# Opt level: O2

Gia_RsbMan_t *
Gia_RsbAlloc(Gia_Man_t *pGia,word *pOffSet,word *pOnSet,Vec_Wrd_t *vSims,int nWords,
            Vec_Wrd_t *vSimsT,int nWordsT,Vec_Int_t *vCands)

{
  int iVar1;
  Gia_RsbMan_t *pGVar2;
  Vec_Int_t *pVVar3;
  Vec_Wec_t *p;
  Vec_Wec_t *p_00;
  word *pwVar4;
  word *pwVar5;
  ulong uVar6;
  ulong uVar7;
  ulong uVar8;
  size_t __nmemb;
  Vec_Wec_t *p_01;
  int iVar9;
  
  pGVar2 = (Gia_RsbMan_t *)calloc(1,0x78);
  if (0x400 < nWords) {
    __assert_fail("nWords <= 1024",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaSimBase.c"
                  ,0x50f,
                  "Gia_RsbMan_t *Gia_RsbAlloc(Gia_Man_t *, word *, word *, Vec_Wrd_t *, int, Vec_Wrd_t *, int, Vec_Int_t *)"
                 );
  }
  if (vSims->nSize != nWords * 0x40 * nWordsT) {
    __assert_fail("Vec_WrdSize(vSims) == 64 * nWords * nWordsT",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaSimBase.c"
                  ,0x510,
                  "Gia_RsbMan_t *Gia_RsbAlloc(Gia_Man_t *, word *, word *, Vec_Wrd_t *, int, Vec_Wrd_t *, int, Vec_Int_t *)"
                 );
  }
  if (vSims->nSize != vSimsT->nSize) {
    __assert_fail("Vec_WrdSize(vSims) == Vec_WrdSize(vSimsT)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaSimBase.c"
                  ,0x511,
                  "Gia_RsbMan_t *Gia_RsbAlloc(Gia_Man_t *, word *, word *, Vec_Wrd_t *, int, Vec_Wrd_t *, int, Vec_Int_t *)"
                 );
  }
  pGVar2->pGia = pGia;
  pGVar2->pOffSet = pOffSet;
  pGVar2->pOnSet = pOnSet;
  pGVar2->nWords = nWords;
  pGVar2->nWordsT = nWordsT;
  pGVar2->vSims = vSims;
  pGVar2->vSimsT = vSimsT;
  pGVar2->vCands = vCands;
  iVar9 = 100;
  pVVar3 = Vec_IntAlloc(100);
  pGVar2->vObjs = pVVar3;
  pVVar3 = Vec_IntAlloc(100);
  pGVar2->vObjs2 = pVVar3;
  p = Vec_WecAlloc(iVar9);
  pGVar2->vSets[0] = p;
  p_00 = Vec_WecAlloc(iVar9);
  pGVar2->vSets[1] = p_00;
  __nmemb = (size_t)nWordsT;
  pwVar4 = (word *)calloc(__nmemb,8);
  pGVar2->pSet[0] = pwVar4;
  pwVar5 = (word *)calloc(__nmemb,8);
  pGVar2->pSet[1] = pwVar5;
  pwVar5 = (word *)calloc(__nmemb,8);
  pGVar2->pSet[2] = pwVar5;
  pVVar3 = Vec_IntAlloc(100);
  pGVar2->vActive = pVVar3;
  for (iVar9 = 0; iVar9 < vCands->nSize; iVar9 = iVar9 + 1) {
    iVar1 = Vec_IntEntry(vCands,iVar9);
    if (SBORROW4(iVar1,nWordsT * 0x40) == iVar1 + nWordsT * -0x40 < 0) {
      __assert_fail("iObj < nWordsT * 64",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaSimBase.c"
                    ,0x524,
                    "Gia_RsbMan_t *Gia_RsbAlloc(Gia_Man_t *, word *, word *, Vec_Wrd_t *, int, Vec_Wrd_t *, int, Vec_Int_t *)"
                   );
    }
    pwVar4[iVar1 >> 6] = pwVar4[iVar1 >> 6] | 1L << ((byte)iVar1 & 0x3f);
  }
  Vec_WecPushLevel(p);
  Vec_WecPushLevel(p_00);
  uVar8 = 0;
  iVar9 = nWords * 0x40;
  if (nWords << 6 < 1) {
    iVar9 = 0;
  }
  while (iVar1 = (int)uVar8, iVar9 != iVar1) {
    uVar6 = pOffSet[uVar8 >> 6] >> ((byte)uVar8 & 0x3f);
    uVar7 = 1L << ((byte)uVar8 & 0x3f) & pOnSet[uVar8 >> 6];
    if ((((pOffSet[uVar8 >> 6] >> (uVar8 & 0x3f) & 1) == 0) || (p_01 = p, uVar7 != 0)) &&
       (((uVar6 & 1) != 0 || (p_01 = p_00, uVar7 == 0)))) {
      if (((uVar6 & 1) != 0) && (uVar7 != 0)) {
        __assert_fail("!Value0 || !Value1",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaSimBase.c"
                      ,0x531,
                      "Gia_RsbMan_t *Gia_RsbAlloc(Gia_Man_t *, word *, word *, Vec_Wrd_t *, int, Vec_Wrd_t *, int, Vec_Int_t *)"
                     );
      }
    }
    else {
      Vec_WecPush(p_01,iVar1,(int)uVar7);
    }
    uVar8 = (ulong)(iVar1 + 1);
  }
  if (p->nSize != 1) {
    __assert_fail("Vec_WecSize(p->vSets[0]) == 1",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaSimBase.c"
                  ,0x533,
                  "Gia_RsbMan_t *Gia_RsbAlloc(Gia_Man_t *, word *, word *, Vec_Wrd_t *, int, Vec_Wrd_t *, int, Vec_Int_t *)"
                 );
  }
  if (p_00->nSize != 1) {
    __assert_fail("Vec_WecSize(p->vSets[1]) == 1",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaSimBase.c"
                  ,0x534,
                  "Gia_RsbMan_t *Gia_RsbAlloc(Gia_Man_t *, word *, word *, Vec_Wrd_t *, int, Vec_Wrd_t *, int, Vec_Int_t *)"
                 );
  }
  Abc_Random(1);
  return pGVar2;
}

Assistant:

Gia_RsbMan_t * Gia_RsbAlloc( Gia_Man_t * pGia, word * pOffSet, word * pOnSet, Vec_Wrd_t * vSims, int nWords, Vec_Wrd_t * vSimsT, int nWordsT, Vec_Int_t * vCands )
{
    int i, iObj;
    Gia_RsbMan_t * p = ABC_CALLOC( Gia_RsbMan_t, 1 );
    assert( nWords <= 1024 );
    assert( Vec_WrdSize(vSims) == 64 * nWords * nWordsT );
    assert( Vec_WrdSize(vSims) == Vec_WrdSize(vSimsT) );
    p->pGia      = pGia;
    p->pOffSet   = pOffSet;
    p->pOnSet    = pOnSet;
    p->nWords    = nWords;
    p->nWordsT   = nWordsT;
    p->vSims     = vSims;
    p->vSimsT    = vSimsT;
    p->vCands    = vCands;
    p->vObjs     = Vec_IntAlloc( 100 );
    p->vObjs2    = Vec_IntAlloc( 100 );
    p->vSets[0]  = Vec_WecAlloc( 1024 );
    p->vSets[1]  = Vec_WecAlloc( 1024 );
    p->pSet[0]   = ABC_CALLOC( word, nWordsT );
    p->pSet[1]   = ABC_CALLOC( word, nWordsT );
    p->pSet[2]   = ABC_CALLOC( word, nWordsT );
    p->vActive   = Vec_IntAlloc( 100 );
    Vec_IntForEachEntry( vCands, iObj, i )
    {
        assert( iObj < nWordsT * 64 );
        Abc_TtSetBit( p->pSet[0], iObj );
    }
    Vec_WecPushLevel( p->vSets[0] );
    Vec_WecPushLevel( p->vSets[1] );
    for ( i = 0; i < 64*nWords; i++ )
    {
        int Value0 = Abc_TtGetBit( pOffSet, i );
        int Value1 = Abc_TtGetBit( pOnSet,  i );
        if ( Value0 && !Value1 )
            Vec_WecPush( p->vSets[0], 0, i );
        else if ( !Value0 && Value1 )
            Vec_WecPush( p->vSets[1], 0, i );
        else assert( !Value0 || !Value1 );
    }
    assert( Vec_WecSize(p->vSets[0]) == 1 );
    assert( Vec_WecSize(p->vSets[1]) == 1 );
    Abc_Random( 1 );
    //Extra_PrintBinary2( stdout, (unsigned*)pOffSet, 64*nWords ); printf( "\n" );
    //Extra_PrintBinary2( stdout, (unsigned*)pOnSet,  64*nWords ); printf( "\n" );
    return p;
}